

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void curses_update_screen(nh_dbuf_entry (*dbuf) [80],wchar_t ux,wchar_t uy)

{
  display_buffer = dbuf;
  draw_map((wchar_t)dbuf,ux);
  if (L'\0' < ux) {
    wmove(mapwin,uy,ux + L'\xffffffff');
  }
  curs_set(L'\0' < ux);
  wnoutrefresh(mapwin);
  return;
}

Assistant:

void curses_update_screen(struct nh_dbuf_entry dbuf[ROWNO][COLNO], int ux, int uy)
{
    display_buffer = dbuf;
    draw_map(ux, uy);
    
    if (ux > 0) {
	wmove(mapwin, uy, ux - 1);
	curs_set(1);
    } else
	curs_set(0);
    wnoutrefresh(mapwin);
}